

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_icu.cpp
# Opt level: O2

QString * __thiscall
QLocalePrivate::toLower(QString *__return_storage_ptr__,QLocalePrivate *this,QString *str,bool *ok)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  bcp47Name((QByteArray *)&QStack_38,this,'_');
  if (QStack_38.ptr == (char *)0x0) {
    QStack_38.ptr = &QByteArray::_empty;
  }
  bVar1 = qt_u_strToCase(str,__return_storage_ptr__,QStack_38.ptr,u_strToLower_70);
  *ok = bVar1;
  QArrayDataPointer<char>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocalePrivate::toLower(const QString &str, bool *ok) const
{
    Q_ASSERT(ok);
    QString out;
    *ok = qt_u_strToCase(str, &out, bcp47Name('_'), u_strToLower);
    return out;
}